

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  bool bVar1;
  ElementSize EVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  Kind KVar5;
  WordCountN<17> WVar6;
  BitsPerElementTableType BVar7;
  ElementCountN<29> EVar8;
  ListElementCount end;
  unsigned_short *puVar9;
  WordCount64 WVar10;
  uint *puVar11;
  unsigned_long uVar12;
  Fault local_100;
  Fault f_2;
  Fault f_1;
  uint wordsPerElement;
  uint j;
  Iterator __end7;
  Iterator __begin7;
  Range<unsigned_int> *__range7;
  Iterator local_c0;
  uint i_2;
  Iterator __end6;
  Iterator __begin6;
  Range<unsigned_int> *__range6;
  word *pos;
  ListElementCount count_1;
  WirePointerCount pointerCount;
  WordCount dataSize;
  Fault local_88;
  Fault f;
  WirePointer *elementTag;
  Iterator local_70;
  uint i_1;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_int> *__range5;
  uint count;
  WirePointer *typedPtr;
  Iterator local_40;
  Iterator local_3e;
  Range<unsigned_short> RStack_3c;
  unsigned_short i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_short> *__range4;
  WirePointer *pointerSection;
  word *ptr_local;
  WirePointer *tag_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  bVar1 = SegmentBuilder::isWritable(segment);
  if (bVar1) {
    KVar5 = WirePointer::kind(tag);
    switch(KVar5) {
    case STRUCT:
      uVar3 = DirectWireValue<unsigned_short>::get(&(tag->field_1).structRef.dataSize);
      uVar4 = DirectWireValue<unsigned_short>::get(&(tag->field_1).structRef.ptrCount);
      RStack_3c = kj::zeroTo<unsigned_short>(uVar4);
      ___end4 = &stack0xffffffffffffffc4;
      local_3e = kj::Range<unsigned_short>::begin(___end4);
      local_40 = kj::Range<unsigned_short>::end(___end4);
      while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_3e,&local_40), bVar1) {
        puVar9 = kj::Range<unsigned_short>::Iterator::operator*(&local_3e);
        zeroObject(segment,capTable,
                   (WirePointer *)(ptr + (long)(int)(uint)uVar3 + (long)(int)(uint)*puVar9));
        kj::Range<unsigned_short>::Iterator::operator++(&local_3e);
      }
      WVar6 = WirePointer::StructRef::wordSize(&(tag->field_1).structRef);
      zeroMemory(ptr,WVar6);
      break;
    case LIST:
      EVar2 = WirePointer::ListRef::elementSize(&(tag->field_1).listRef);
      switch(EVar2) {
      case VOID:
        break;
      case BIT:
      case BYTE:
      case TWO_BYTES:
      case FOUR_BYTES:
      case EIGHT_BYTES:
        EVar8 = WirePointer::ListRef::elementCount(&(tag->field_1).listRef);
        uVar12 = upgradeBound<unsigned_long,unsigned_int>(EVar8);
        EVar2 = WirePointer::ListRef::elementSize(&(tag->field_1).listRef);
        BVar7 = dataBitsPerElement(EVar2);
        WVar10 = roundBitsUpToWords(uVar12 * BVar7);
        zeroMemory(ptr,(WordCountN<29>)WVar10);
        break;
      case POINTER:
        EVar8 = WirePointer::ListRef::elementCount(&(tag->field_1).listRef);
        ___end5 = kj::zeroTo<unsigned_int>(EVar8);
        i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5);
        local_70 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5);
        while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_1,&local_70),
              bVar1) {
          puVar11 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
          zeroObject(segment,capTable,(WirePointer *)(ptr + *puVar11));
          kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
        }
        zeroMemory((WirePointer *)ptr,EVar8);
        break;
      case INLINE_COMPOSITE:
        f.exception = (Exception *)ptr;
        KVar5 = WirePointer::kind((WirePointer *)ptr);
        if (KVar5 != STRUCT) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                    (&local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x2b7,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                     "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                     (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
          kj::_::Debug::Fault::fatal(&local_88);
        }
        uVar3 = DirectWireValue<unsigned_short>::get
                          ((DirectWireValue<unsigned_short> *)
                           ((long)&((f.exception)->ownFile).content.ptr + 4));
        uVar4 = DirectWireValue<unsigned_short>::get
                          ((DirectWireValue<unsigned_short> *)
                           ((long)&((f.exception)->ownFile).content.ptr + 6));
        end = WirePointer::inlineCompositeListElementCount((WirePointer *)f.exception);
        if (uVar4 != 0) {
          __range6 = (Range<unsigned_int> *)(ptr + 1);
          ___end6 = kj::zeroTo<unsigned_int>(end);
          i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6);
          local_c0 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_2,&local_c0),
                bVar1) {
            kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
            __range6 = __range6 + uVar3;
            ___end7 = kj::zeroTo<unsigned_int>((uint)uVar4);
            j = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end7);
            wordsPerElement = (uint)kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end7);
            while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=
                                     ((Iterator *)&j,(Iterator *)&wordsPerElement), bVar1) {
              kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&j);
              zeroObject(segment,capTable,(WirePointer *)__range6);
              __range6 = __range6 + 1;
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&j);
            }
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
          }
        }
        WVar6 = WirePointer::StructRef::wordSize
                          ((StructRef *)((long)&((f.exception)->ownFile).content.ptr + 4));
        uVar12 = upgradeBound<unsigned_long,unsigned_int>(end);
        uVar12 = assertMaxBits<29u,unsigned_long,capnp::_::WireHelpers::zeroObject(capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::WirePointer*,capnp::word*)::_lambda()_1_>
                           (uVar12 * WVar6 + 1,(anon_class_1_0_00000001 *)((long)&f_1.exception + 7)
                           );
        zeroMemory(ptr,(WordCountN<29>)uVar12);
      }
      break;
    case FAR:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x2d4,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                 (char (*) [24])"Unexpected FAR pointer.");
      kj::_::Debug::Fault::~Fault(&f_2);
      break;
    case OTHER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x2d9,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
                 (char (*) [26])"Unexpected OTHER pointer.");
      kj::_::Debug::Fault::~Fault(&local_100);
    }
  }
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }